

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void error<String,int,String,String>
               (char *fmtstr,String *args,int *args_1,String *args_2,String *args_3)

{
  String SStack_68;
  String local_48;
  
  String::String(&local_48,fmtstr);
  format<String,int,String,String>(&SStack_68,&local_48,args,args_1,args_2,args_3);
  error(&SStack_68);
  std::__cxx11::string::~string((string *)&SStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}